

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O0

sljit_s32 emit_do_imm32(sljit_compiler *compiler,sljit_u8 rex,sljit_u8 opcode,sljit_sw imm)

{
  int iVar1;
  undefined1 *puVar2;
  sljit_u8 *psStack_30;
  sljit_s32 length;
  sljit_u8 *inst;
  sljit_sw imm_local;
  sljit_u8 opcode_local;
  sljit_u8 rex_local;
  sljit_compiler *compiler_local;
  
  iVar1 = (rex != '\0') + 5;
  puVar2 = (undefined1 *)ensure_buf(compiler,(long)(int)((rex != '\0') + 6));
  if (puVar2 == (undefined1 *)0x0) {
    compiler_local._4_4_ = compiler->error;
  }
  else {
    *puVar2 = (char)iVar1;
    compiler->size = (long)iVar1 + compiler->size;
    psStack_30 = puVar2 + 1;
    if (rex != '\0') {
      psStack_30 = puVar2 + 2;
      puVar2[1] = rex;
    }
    *psStack_30 = opcode;
    sljit_unaligned_store_s32(psStack_30 + 1,(sljit_s32)imm);
    compiler_local._4_4_ = 0;
  }
  return compiler_local._4_4_;
}

Assistant:

static sljit_s32 emit_do_imm32(struct sljit_compiler *compiler, sljit_u8 rex, sljit_u8 opcode, sljit_sw imm)
{
	sljit_u8 *inst;
	sljit_s32 length = 1 + (rex ? 1 : 0) + sizeof(sljit_s32);

	inst = (sljit_u8*)ensure_buf(compiler, 1 + length);
	FAIL_IF(!inst);
	INC_SIZE(length);
	if (rex)
		*inst++ = rex;
	*inst++ = opcode;
	sljit_unaligned_store_s32(inst, imm);
	return SLJIT_SUCCESS;
}